

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void hdma_copy_byte(Emulator *e)

{
  Address addr;
  ushort uVar1;
  MemoryTypeAddressPair pair;
  u8 local_19;
  MemoryMapType MStack_18;
  u8 value;
  MemoryTypeAddressPair source_pair;
  Emulator *e_local;
  
  addr = (e->state).hdma.source;
  (e->state).hdma.source = addr + 1;
  pair = map_hdma_source_address(addr);
  MStack_18 = pair.type;
  if (MStack_18 == MEMORY_MAP_VRAM) {
    local_19 = 0xff;
  }
  else {
    local_19 = read_u8_pair(e,pair,FALSE);
  }
  uVar1 = (e->state).hdma.dest;
  (e->state).hdma.dest = uVar1 + 1;
  write_vram(e,uVar1 & 0x1fff,local_19);
  (e->state).hdma.block_bytes = (e->state).hdma.block_bytes + '\x01';
  if (0xf < (e->state).hdma.block_bytes) {
    (e->state).hdma.block_bytes = (e->state).hdma.block_bytes + 0xf0;
    (e->state).hdma.blocks = (e->state).hdma.blocks + 0xff;
    if ((e->state).hdma.mode == HDMA_TRANSFER_MODE_GDMA) {
      if ((e->state).hdma.blocks == 0xff) {
        (e->state).hdma.state = DMA_INACTIVE;
      }
    }
    else {
      (e->state).hdma.state = DMA_INACTIVE;
    }
  }
  return;
}

Assistant:

static void hdma_copy_byte(Emulator* e) {
  MemoryTypeAddressPair source_pair = map_hdma_source_address(HDMA.source++);
  u8 value;
  if (UNLIKELY(source_pair.type == MEMORY_MAP_VRAM)) {
    /* TODO(binji): According to TCAGBD this should read "two unknown bytes",
     * then 0xff for the rest. */
    value = INVALID_READ_BYTE;
  } else {
    value = read_u8_pair(e, source_pair, FALSE);
  }
  write_vram(e, HDMA.dest++ & ADDR_MASK_8K, value);
  HDMA.block_bytes++;
  if (VALUE_WRAPPED(HDMA.block_bytes, 16)) {
    --HDMA.blocks;
    if (HDMA.mode == HDMA_TRANSFER_MODE_GDMA) {
      if (HDMA.blocks == 0xff) {
        HDMA.state = DMA_INACTIVE;
      }
    } else {
      HDMA.state = DMA_INACTIVE;
    }
  }
}